

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator--
          (Roaring64MapSetBitBiDirectionalIterator *this,int param_2)

{
  bool bVar1;
  _Self *__x;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *in_RSI;
  type_of_iterator *in_RDI;
  roaring_uint32_iterator_t *in_stack_ffffffffffffffb8;
  roaring_uint32_iterator_t *newit;
  _Self local_20;
  _Self local_18 [3];
  
  memcpy(in_RDI,in_RSI,0x38);
  __x = in_RSI + 1;
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cend((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(__x,local_18);
  if (bVar1) {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator--
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)in_RDI);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x1250b8
              );
    roaring_iterator_init_last((roaring_bitmap_t *)in_RDI,in_stack_ffffffffffffffb8);
  }
  else {
    roaring_uint32_iterator_previous(in_stack_ffffffffffffffb8);
    while (((*(byte *)((long)&in_RSI[6]._M_node + 4) ^ 0xff) & 1) != 0) {
      newit = (roaring_uint32_iterator_t *)(in_RSI + 1);
      local_20._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::cbegin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)newit);
      bVar1 = std::operator==((_Self *)newit,&local_20);
      if (bVar1) {
        return in_RDI;
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator--
                (in_RSI,(int)((ulong)in_RDI >> 0x20));
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                 0x125146);
      roaring_iterator_init_last((roaring_bitmap_t *)in_RDI,newit);
    }
  }
  return in_RDI;
}

Assistant:

type_of_iterator operator--(int) {  // i--, must return orig. value
        Roaring64MapSetBitBiDirectionalIterator orig(*this);
        if (map_iter == p->cend()) {
            --map_iter;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
            return orig;
        }

        roaring_uint32_iterator_previous(&i);
        while (!i.has_value) {
            if (map_iter == p->cbegin()) return orig;
            map_iter--;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
        }
        return orig;
    }